

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void al_hold_bitmap_drawing(_Bool hold)

{
  _Bool _Var1;
  ALLEGRO_DISPLAY *pAVar2;
  byte in_DIL;
  ALLEGRO_TRANSFORM ident;
  ALLEGRO_TRANSFORM old;
  ALLEGRO_DISPLAY *current_display;
  ALLEGRO_TRANSFORM *in_stack_ffffffffffffff68;
  ALLEGRO_TRANSFORM *in_stack_ffffffffffffff70;
  
  _Var1 = (_Bool)(in_DIL & 1);
  pAVar2 = al_get_current_display();
  if (pAVar2 != (ALLEGRO_DISPLAY *)0x0) {
    if ((_Var1 == false) || ((pAVar2->cache_enabled & 1U) != 0)) {
      pAVar2->cache_enabled = _Var1;
    }
    else {
      al_get_current_transform();
      al_copy_transform(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      al_identity_transform((ALLEGRO_TRANSFORM *)&stack0xffffffffffffff70);
      al_use_transform(in_stack_ffffffffffffff70);
      pAVar2->cache_enabled = _Var1;
      al_use_transform(in_stack_ffffffffffffff70);
    }
    if (_Var1 == false) {
      (*pAVar2->vt->flush_vertex_cache)(pAVar2);
      al_get_current_transform();
      al_use_transform(in_stack_ffffffffffffff70);
    }
  }
  return;
}

Assistant:

void al_hold_bitmap_drawing(bool hold)
{
   ALLEGRO_DISPLAY *current_display = al_get_current_display();

   if (current_display) {
      if (hold && !current_display->cache_enabled) {
         /*
          * Set the hardware transformation to identity, but keep the bitmap
          * transform the same as it was. Relies on the fact that when bitmap
          * holding is turned on, al_use_transform does not update the hardware
          * transformation.
          */
         ALLEGRO_TRANSFORM old, ident;
         al_copy_transform(&old, al_get_current_transform());
         al_identity_transform(&ident);

         al_use_transform(&ident);
         current_display->cache_enabled = hold;
         al_use_transform(&old);
      }
      else {
         current_display->cache_enabled = hold;
      }

      if (!hold) {
         current_display->vt->flush_vertex_cache(current_display);
         /*
          * Reset the hardware transform to match the stored transform.
          */
         al_use_transform(al_get_current_transform());
      }
   }
}